

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radial_factory.hpp
# Opt level: O1

RadialQuad IntegratorXX::radial_from_string(string *name)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  runtime_error *this;
  RadialQuad RVar4;
  size_type sVar5;
  
  sVar1 = name->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (name->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar3 = toupper((int)pcVar2[sVar5]);
      pcVar2[sVar5] = (char)iVar3;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    RVar4 = Becke;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)name);
    RVar4 = MuraKnowles;
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)name);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)name);
        RVar4 = MurrayHandyLaming;
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)name);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)name);
            RVar4 = TreutlerAhlrichs;
            if (iVar3 != 0) {
              iVar3 = std::__cxx11::string::compare((char *)name);
              if (iVar3 != 0) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this,"Unrecognized Radial Quadrature");
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
            }
          }
        }
      }
    }
  }
  return RVar4;
}

Assistant:

RadialQuad radial_from_string(std::string name) {
  std::transform(name.begin(), name.end(), name.begin(), ::toupper);
  if(name == "BECKE")             return RadialQuad::Becke;
  if(name == "MURAKNOWLES")       return RadialQuad::MuraKnowles;
  if(name == "MK")                return RadialQuad::MuraKnowles;
  if(name == "MURRAYHANDYLAMING") return RadialQuad::MurrayHandyLaming;
  if(name == "MHL")               return RadialQuad::MurrayHandyLaming;
  if(name == "TREUTLERAHLRICHS")  return RadialQuad::TreutlerAhlrichs;
  if(name == "TA")                return RadialQuad::TreutlerAhlrichs;

  throw std::runtime_error("Unrecognized Radial Quadrature");
}